

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1a1edb::PeerManagerImpl::BlockChecked
          (PeerManagerImpl *this,CBlock *block,BlockValidationState *state)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  bool bVar4;
  iterator iVar5;
  pointer ppVar6;
  size_type sVar7;
  size_type sVar8;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  iterator it;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock46;
  uint256 hash;
  ValidationState<BlockValidationResult> *in_stack_fffffffffffffed8;
  map<uint256,_std::pair<long,_bool>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_bool>_>_>_>
  *in_stack_fffffffffffffee0;
  PeerManagerImpl *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef8;
  undefined2 in_stack_fffffffffffffefc;
  undefined1 in_stack_fffffffffffffefe;
  undefined1 in_stack_fffffffffffffeff;
  char *in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffff10;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  allocator<char> *__s;
  CNodeState *in_stack_ffffffffffffff28;
  undefined1 via_compact_block;
  BlockValidationState *in_stack_ffffffffffffff48;
  PeerManagerImpl *in_stack_ffffffffffffff50;
  PeerManagerImpl *in_stack_ffffffffffffff58;
  ChainstateManager *in_stack_ffffffffffffff80;
  NodeId in_stack_ffffffffffffff88;
  allocator<char> local_69;
  _Base_ptr local_68;
  _Base_ptr local_60;
  NodeId in_stack_ffffffffffffffd8;
  
  via_compact_block = (undefined1)((ulong)in_RDI >> 0x38);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffed8);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18),in_stack_ffffffffffffff10
             ,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
             CONCAT13(in_stack_fffffffffffffeff,
                      CONCAT12(in_stack_fffffffffffffefe,in_stack_fffffffffffffefc)),
             SUB41((uint)in_stack_fffffffffffffef8 >> 0x18,0));
  CBlockHeader::GetHash
            ((CBlockHeader *)
             CONCAT17(in_stack_fffffffffffffeff,
                      CONCAT16(in_stack_fffffffffffffefe,
                               CONCAT24(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8))));
  iVar5 = std::
          map<uint256,_std::pair<long,_bool>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_bool>_>_>_>
          ::find(in_stack_fffffffffffffee0,(key_type *)in_stack_fffffffffffffed8);
  local_60 = iVar5._M_node;
  bVar2 = ValidationState<BlockValidationResult>::IsInvalid(in_stack_fffffffffffffed8);
  bVar4 = false;
  if (bVar2) {
    local_68 = (_Base_ptr)
               std::
               map<uint256,_std::pair<long,_bool>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_bool>_>_>_>
               ::end(in_stack_fffffffffffffee0);
    bVar2 = std::operator==((_Self *)in_stack_fffffffffffffee8,(_Self *)in_stack_fffffffffffffee0);
    bVar4 = false;
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      std::_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_bool>_>_>::operator->
                ((_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_bool>_>_> *)
                 in_stack_fffffffffffffed8);
      in_stack_ffffffffffffff28 = State(in_stack_fffffffffffffee8,(NodeId)in_stack_fffffffffffffee0)
      ;
      bVar4 = in_stack_ffffffffffffff28 != (CNodeState *)0x0;
    }
  }
  if (bVar4) {
    std::_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_bool>_>_>::operator->
              ((_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_bool>_>_> *)
               in_stack_fffffffffffffed8);
    ppVar6 = std::_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_bool>_>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_bool>_>_> *)
                        in_stack_fffffffffffffed8);
    bVar3 = (ppVar6->second).second ^ 1;
    __s = &local_69;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff28,(char *)__s,
               (allocator<char> *)CONCAT17(bVar3,in_stack_ffffffffffffff18));
    MaybePunishNodeForBlock
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff88,in_stack_ffffffffffffff48,
               (bool)via_compact_block,(string *)iVar5._M_node);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffed8);
    std::allocator<char>::~allocator(&local_69);
  }
  else {
    in_stack_fffffffffffffeff =
         ValidationState<BlockValidationResult>::IsValid(in_stack_fffffffffffffed8);
    if (((bool)in_stack_fffffffffffffeff) &&
       (in_stack_fffffffffffffefe =
             ChainstateManager::IsInitialBlockDownload(in_stack_ffffffffffffff80),
       !(bool)in_stack_fffffffffffffefe)) {
      sVar7 = std::
              multimap<uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
              ::count((multimap<uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
                       *)in_stack_fffffffffffffee8,(key_type *)in_stack_fffffffffffffee0);
      sVar8 = std::
              multimap<uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
              ::size((multimap<uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
                      *)in_stack_fffffffffffffed8);
      if (sVar7 == sVar8) {
        std::
        map<uint256,_std::pair<long,_bool>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_bool>_>_>_>
        ::end(in_stack_fffffffffffffee0);
        bVar4 = std::operator==((_Self *)in_stack_fffffffffffffee8,
                                (_Self *)in_stack_fffffffffffffee0);
        if (((bVar4 ^ 0xffU) & 1) != 0) {
          std::_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_bool>_>_>::operator->
                    ((_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_bool>_>_> *)
                     in_stack_fffffffffffffed8);
          MaybeSetPeerAsAnnouncingHeaderAndIDs(in_stack_ffffffffffffff58,in_stack_ffffffffffffffd8);
        }
      }
    }
  }
  std::
  map<uint256,_std::pair<long,_bool>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_bool>_>_>_>
  ::end(in_stack_fffffffffffffee0);
  bVar4 = std::operator==((_Self *)in_stack_fffffffffffffee8,(_Self *)in_stack_fffffffffffffee0);
  if (((bVar4 ^ 0xffU) & 1) != 0) {
    iVar5._M_node._4_2_ = in_stack_fffffffffffffefc;
    iVar5._M_node._0_4_ = in_stack_fffffffffffffef8;
    iVar5._M_node._6_1_ = in_stack_fffffffffffffefe;
    iVar5._M_node._7_1_ = in_stack_fffffffffffffeff;
    std::
    map<uint256,std::pair<long,bool>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::pair<long,bool>>>>
    ::erase_abi_cxx11_(in_stack_fffffffffffffee0,iVar5);
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffed8);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void PeerManagerImpl::BlockChecked(const CBlock& block, const BlockValidationState& state)
{
    LOCK(cs_main);

    const uint256 hash(block.GetHash());
    std::map<uint256, std::pair<NodeId, bool>>::iterator it = mapBlockSource.find(hash);

    // If the block failed validation, we know where it came from and we're still connected
    // to that peer, maybe punish.
    if (state.IsInvalid() &&
        it != mapBlockSource.end() &&
        State(it->second.first)) {
            MaybePunishNodeForBlock(/*nodeid=*/ it->second.first, state, /*via_compact_block=*/ !it->second.second);
    }
    // Check that:
    // 1. The block is valid
    // 2. We're not in initial block download
    // 3. This is currently the best block we're aware of. We haven't updated
    //    the tip yet so we have no way to check this directly here. Instead we
    //    just check that there are currently no other blocks in flight.
    else if (state.IsValid() &&
             !m_chainman.IsInitialBlockDownload() &&
             mapBlocksInFlight.count(hash) == mapBlocksInFlight.size()) {
        if (it != mapBlockSource.end()) {
            MaybeSetPeerAsAnnouncingHeaderAndIDs(it->second.first);
        }
    }
    if (it != mapBlockSource.end())
        mapBlockSource.erase(it);
}